

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void operator_delete(void *p,size_t size)

{
  size_t size_local;
  void *p_local;
  
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p,-0x145237f,size);
  force_frame();
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete_sized(void* p, size_t size) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kNewType, size);
  force_frame();
}